

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv__tcp_connect(uv_connect_t *req,uv_tcp_t *handle,sockaddr *addr,uint addrlen,uv_connect_cb cb)

{
  anon_union_8_2_bf76bca6_for_active_reqs *paVar1;
  int iVar2;
  int *piVar3;
  
  if (handle->type != UV_TCP) {
    __assert_fail("handle->type == UV_TCP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/tcp.c"
                  ,0xd5,
                  "int uv__tcp_connect(uv_connect_t *, uv_tcp_t *, const struct sockaddr *, unsigned int, uv_connect_cb)"
                 );
  }
  iVar2 = -0x72;
  if (handle->connect_req == (uv_connect_t *)0x0) {
    if (handle->delayed_error == 0) {
      iVar2 = maybe_new_socket(handle,(uint)addr->sa_family,0xc000);
      if (iVar2 != 0) {
        return iVar2;
      }
      piVar3 = __errno_location();
      do {
        *piVar3 = 0;
        iVar2 = connect((handle->io_watcher).fd,(sockaddr *)addr,addrlen);
        if (iVar2 != -1) goto LAB_0025590b;
        iVar2 = *piVar3;
      } while (iVar2 == 4);
      if ((iVar2 != 0) && (iVar2 != 0x73)) {
        if (iVar2 != 0x6f) {
          return -iVar2;
        }
        handle->delayed_error = -0x6f;
      }
    }
LAB_0025590b:
    req->type = UV_CONNECT;
    paVar1 = &handle->loop->active_reqs;
    paVar1->count = paVar1->count + 1;
    req->cb = cb;
    req->handle = (uv_stream_t *)handle;
    req->queue[0] = req->queue;
    req->queue[1] = req->queue;
    handle->connect_req = req;
    uv__io_start(handle->loop,&handle->io_watcher,4);
    iVar2 = 0;
    if (handle->delayed_error != 0) {
      uv__io_feed(handle->loop,&handle->io_watcher);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int uv__tcp_connect(uv_connect_t* req,
                    uv_tcp_t* handle,
                    const struct sockaddr* addr,
                    unsigned int addrlen,
                    uv_connect_cb cb) {
  int err;
  int r;

  assert(handle->type == UV_TCP);

  if (handle->connect_req != NULL)
    return UV_EALREADY;  /* FIXME(bnoordhuis) UV_EINVAL or maybe UV_EBUSY. */

  if (handle->delayed_error != 0)
    goto out;

  err = maybe_new_socket(handle,
                         addr->sa_family,
                         UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
  if (err)
    return err;

  do {
    errno = 0;
    r = connect(uv__stream_fd(handle), addr, addrlen);
  } while (r == -1 && errno == EINTR);

  /* We not only check the return value, but also check the errno != 0.
   * Because in rare cases connect() will return -1 but the errno
   * is 0 (for example, on Android 4.3, OnePlus phone A0001_12_150227)
   * and actually the tcp three-way handshake is completed.
   */
  if (r == -1 && errno != 0) {
    if (errno == EINPROGRESS)
      ; /* not an error */
    else if (errno == ECONNREFUSED
#if defined(__OpenBSD__)
      || errno == EINVAL
#endif
      )
    /* If we get ECONNREFUSED (Solaris) or EINVAL (OpenBSD) wait until the
     * next tick to report the error. Solaris and OpenBSD wants to report
     * immediately -- other unixes want to wait.
     */
      handle->delayed_error = UV__ERR(ECONNREFUSED);
    else
      return UV__ERR(errno);
  }

out:

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->cb = cb;
  req->handle = (uv_stream_t*) handle;
  QUEUE_INIT(&req->queue);
  handle->connect_req = req;

  uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

  if (handle->delayed_error)
    uv__io_feed(handle->loop, &handle->io_watcher);

  return 0;
}